

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O2

double raplcap_pd_get_energy_counter_max(raplcap *rc,uint32_t pkg,uint32_t die,raplcap_zone zone)

{
  raplcap_msr *ctx;
  off_t oVar1;
  double dVar2;
  
  ctx = get_state(rc,pkg,die);
  oVar1 = zone_to_msr_offset(zone,ZONE_OFFSETS_ENERGY);
  if ((ctx != (raplcap_msr *)0x0) && (-1 < oVar1)) {
    dVar2 = msr_get_energy_counter_max(&ctx->ctx,zone);
    return dVar2;
  }
  return -1.0;
}

Assistant:

double raplcap_pd_get_energy_counter_max(const raplcap* rc, uint32_t pkg, uint32_t die, raplcap_zone zone) {
  const raplcap_msr* state = get_state(rc, pkg, die);
  const off_t msr = zone_to_msr_offset(zone, ZONE_OFFSETS_ENERGY);
  raplcap_log(DEBUG, "raplcap_pd_get_energy_counter_max: pkg=%"PRIu32", die=%"PRIu32", zone=%d\n", pkg, die, zone);
  if (state == NULL || msr < 0) {
    return -1;
  }
  return msr_get_energy_counter_max(&state->ctx, zone);
}